

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall TArray<FieldDesc,_FieldDesc>::ShrinkToFit(TArray<FieldDesc,_FieldDesc> *this)

{
  uint uVar1;
  
  uVar1 = this->Count;
  if (uVar1 < this->Most) {
    this->Most = uVar1;
    if (uVar1 != 0) {
      DoResize(this);
      return;
    }
    if (this->Array != (FieldDesc *)0x0) {
      M_Free(this->Array);
      this->Array = (FieldDesc *)0x0;
    }
  }
  return;
}

Assistant:

void ShrinkToFit ()
	{
		if (Most > Count)
		{
			Most = Count;
			if (Most == 0)
			{
				if (Array != NULL)
				{
					M_Free (Array);
					Array = NULL;
				}
			}
			else
			{
				DoResize ();
			}
		}
	}